

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O1

void SetScroller(int tag,EScroll type,double dx,double dy)

{
  bool bVar1;
  DThinker *pDVar2;
  DScroller *this;
  int iVar3;
  FSectorTagIterator itr;
  TThinkerIterator<DScroller> iterator;
  FSectorTagIterator local_50;
  FThinkerIterator local_48;
  
  FThinkerIterator::FThinkerIterator(&local_48,DScroller::RegistrationInfo.MyClass,0x20);
  iVar3 = 0;
  pDVar2 = FThinkerIterator::Next(&local_48,false);
  if (pDVar2 != (DThinker *)0x0) {
    do {
      if ((*(EScroll *)&pDVar2[1].super_DObject._vptr_DObject == type) &&
         (bVar1 = FTagManager::SectorHasTag(&tagManager,*(int *)&pDVar2[1].super_DObject.GCNext,tag)
         , bVar1)) {
        iVar3 = iVar3 + 1;
        pDVar2[1].super_DObject.Class = (PClass *)dx;
        pDVar2[1].super_DObject.ObjNext = (DObject *)dy;
      }
      pDVar2 = FThinkerIterator::Next(&local_48,false);
    } while (pDVar2 != (DThinker *)0x0);
    if (0 < iVar3) {
      return;
    }
  }
  if ((((dx != 0.0) || (NAN(dx))) || (dy != 0.0)) || (NAN(dy))) {
    if (tag == 0) {
      local_50.start = 0;
    }
    else {
      local_50.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    }
    local_50.searchtag = tag;
    while (iVar3 = FSectorTagIterator::Next(&local_50), -1 < iVar3) {
      this = (DScroller *)
             M_Malloc_Dbg(0x90,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
      DScroller::DScroller(this,type,dx,dy,-1,iVar3,0,scw_all);
    }
  }
  return;
}

Assistant:

void SetScroller (int tag, EScroll type, double dx, double dy)
{
	TThinkerIterator<DScroller> iterator (STAT_SCROLLER);
	DScroller *scroller;
	int i;

	// Check if there is already a scroller for this tag
	// If at least one sector with this tag is scrolling, then they all are.
	// If the deltas are both 0, we don't remove the scroller, because a
	// displacement/accelerative scroller might have been set up, and there's
	// no way to create one after the level is fully loaded.
	i = 0;
	while ( (scroller = iterator.Next ()) )
	{
		if (scroller->IsType (type))
		{
			if (tagManager.SectorHasTag(scroller->GetAffectee (), tag))
			{
				i++;
				scroller->SetRate (dx, dy);
			}
		}
	}

	if (i > 0 || (dx == 0 && dy == 0))
	{
		return;
	}

	// Need to create scrollers for the sector(s)
	FSectorTagIterator itr(tag);
	while ((i = itr.Next()) >= 0)
	{
		new DScroller (type, dx, dy, -1, i, 0);
	}
}